

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::detail::
binary_writer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_char>
::write_bson_binary(binary_writer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_char>
                    *this,string_t *name,binary_t *value)

{
  bool bVar1;
  size_type sVar2;
  subtype_type sVar3;
  element_type *peVar4;
  uchar *puVar5;
  uchar local_29;
  binary_t *value_local;
  string_t *name_local;
  binary_writer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_unsigned_char>
  *this_local;
  
  write_bson_entry_header(this,name,'\x05');
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    (&value->super_vector<unsigned_char,_std::allocator<unsigned_char>_>);
  binary_writer<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char>
  ::write_number<int,true>
            ((binary_writer<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char>
              *)this,(int)sVar2);
  bVar1 = byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::
          has_subtype(value);
  if (bVar1) {
    sVar3 = byte_container_with_subtype<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::subtype(value);
    local_29 = (uchar)sVar3;
  }
  else {
    local_29 = '\0';
  }
  binary_writer<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char>
  ::write_number<unsigned_char,false>
            ((binary_writer<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_char>
              *)this,local_29);
  peVar4 = std::
           __shared_ptr_access<nlohmann::detail::output_adapter_protocol<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<nlohmann::detail::output_adapter_protocol<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->oa);
  puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     (&value->super_vector<unsigned_char,_std::allocator<unsigned_char>_>);
  sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    (&value->super_vector<unsigned_char,_std::allocator<unsigned_char>_>);
  (*peVar4->_vptr_output_adapter_protocol[1])(peVar4,puVar5,sVar2);
  return;
}

Assistant:

void write_bson_binary(const string_t& name,
                           const binary_t& value)
    {
        write_bson_entry_header(name, 0x05);

        write_number<std::int32_t, true>(static_cast<std::int32_t>(value.size()));
        write_number(value.has_subtype() ? static_cast<std::uint8_t>(value.subtype()) : std::uint8_t(0x00));

        oa->write_characters(reinterpret_cast<const CharType*>(value.data()), value.size());
    }